

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCountAigNodes(Kit_DsdNtk_t *pNtk)

{
  Kit_DsdObj_t *pKVar1;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < (int)(uint)pNtk->nNodes; local_1c = local_1c + 1) {
    pKVar1 = pNtk->pNodes[local_1c];
    if (((uint)*pKVar1 >> 6 & 7) == 3) {
      local_20 = (((uint)*pKVar1 >> 0x1a) - 1) + local_20;
    }
    else if (((uint)*pKVar1 >> 6 & 7) == 4) {
      local_20 = (((uint)*pKVar1 >> 0x1a) - 1) * 3 + local_20;
    }
    else if (((uint)*pKVar1 >> 6 & 7) == 5) {
      local_20 = local_20 + 3;
    }
  }
  return local_20;
}

Assistant:

int Kit_DsdCountAigNodes( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    int i, Counter = 0;
    for ( i = 0; i < pNtk->nNodes; i++ )
    {
        pObj = pNtk->pNodes[i];
        if ( pObj->Type == KIT_DSD_AND )
            Counter += ((int)pObj->nFans - 1);
        else if ( pObj->Type == KIT_DSD_XOR )
            Counter += ((int)pObj->nFans - 1) * 3;
        else if ( pObj->Type == KIT_DSD_PRIME ) // assuming MUX decomposition
            Counter += 3;
    }
    return Counter;
}